

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::TransformFeedback::FunctionalTest::FunctionalTest
          (FunctionalTest *this,Context *context)

{
  Context *context_local;
  FunctionalTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"xfb_functional","Transform Feedback Functional Test");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FunctionalTest_03240060;
  this->m_gl_getTransformFeedbackiv = (GetTransformFeedbackiv_ProcAddress)0x0;
  this->m_gl_TransformFeedbackBufferBase = (TransformFeedbackBufferBase_ProcAddress)0x0;
  this->m_xfb_dsa = 0;
  this->m_bo = 0;
  this->m_po = 0;
  this->m_vao = 0;
  return;
}

Assistant:

FunctionalTest::FunctionalTest(deqp::Context& context)
	: deqp::TestCase(context, "xfb_functional", "Transform Feedback Functional Test")
	, m_gl_getTransformFeedbackiv(DE_NULL)
	, m_gl_TransformFeedbackBufferBase(DE_NULL)
	, m_xfb_dsa(0)
	, m_bo(0)
	, m_po(0)
	, m_vao(0)
{
	/* Intentionally left blank. */
}